

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall QNetworkRequestFactory::clearPassword(QNetworkRequestFactory *this)

{
  if ((((this->d).d.ptr)->password).d.size != 0) {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach(&this->d);
    QString::clear(&((this->d).d.ptr)->password);
    return;
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }